

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::Equal_Full(Var aLeft,Var aRight,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  double dVar7;
  double dVar8;
  BOOL res_1;
  BOOL res;
  BOOL result;
  ScriptContext *requestContext_local;
  Var aRight_local;
  Var aLeft_local;
  
  _res = requestContext;
  requestContext_local = (ScriptContext *)aRight;
  aRight_local = aLeft;
  if (aLeft == aRight) {
    bVar2 = JavascriptNumber::Is(aLeft);
    if (bVar2) {
      dVar7 = JavascriptNumber::GetValue(aRight_local);
      BVar3 = JavascriptNumber::IsNan(dVar7);
      if (BVar3 != 0) {
        return 0;
      }
    }
    aLeft_local._4_4_ = 1;
  }
  else {
    res_1 = 0;
    bVar2 = TaggedInt::Is(aLeft);
    if (bVar2) {
      bVar2 = TaggedInt::Is(requestContext_local);
      if (bVar2) {
        aLeft_local._4_4_ = 0;
      }
      else {
        bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(requestContext_local);
        if (bVar2) {
          dVar7 = TaggedInt::ToDouble(aRight_local);
          dVar8 = JavascriptNumber::GetValue(requestContext_local);
          aLeft_local._4_4_ = (uint)(dVar7 == dVar8);
        }
        else {
          pRVar6 = UnsafeVarTo<Js::RecyclableObject>(requestContext_local);
          iVar4 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x2e])(pRVar6,aRight_local,&res_1,_res);
          if (iVar4 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0x240,"(res)","Should have handled this");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          aLeft_local._4_4_ = res_1;
        }
      }
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aRight_local);
      if (bVar2) {
        bVar2 = TaggedInt::Is(requestContext_local);
        if (bVar2) {
          dVar7 = TaggedInt::ToDouble(requestContext_local);
          dVar8 = JavascriptNumber::GetValue(aRight_local);
          aLeft_local._4_4_ = (uint)(dVar7 == dVar8);
        }
        else {
          bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(requestContext_local);
          if (bVar2) {
            dVar7 = JavascriptNumber::GetValue(aRight_local);
            dVar8 = JavascriptNumber::GetValue(requestContext_local);
            aLeft_local._4_4_ = (uint)(dVar7 == dVar8);
          }
          else {
            pRVar6 = UnsafeVarTo<Js::RecyclableObject>(requestContext_local);
            iVar4 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x2e])(pRVar6,aRight_local,&res_1,_res);
            if (iVar4 == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                          ,0x251,"(res)","Should have handled this");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 0;
            }
            aLeft_local._4_4_ = res_1;
          }
        }
      }
      else {
        pRVar6 = UnsafeVarTo<Js::RecyclableObject>(aRight_local);
        iVar4 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x2e])(pRVar6,requestContext_local,&res_1,_res);
        if (iVar4 == 0) {
          aLeft_local._4_4_ = 0;
        }
        else {
          aLeft_local._4_4_ = res_1;
        }
      }
    }
  }
  return aLeft_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::Equal_Full(Var aLeft, Var aRight, ScriptContext* requestContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_Equal_Full);
        //
        // Fast-path SmInts and paired Number combinations.
        //

        if (aLeft == aRight)
        {
            if (JavascriptNumber::Is(aLeft) && JavascriptNumber::IsNan(JavascriptNumber::GetValue(aLeft)))
            {
                return false;
            }
            else
            {
                return true;
            }
        }

        BOOL result = false;

        if (TaggedInt::Is(aLeft))
        {
            if (TaggedInt::Is(aRight))
            {
                // If aLeft == aRight, we would already have returned true above.
                return false;
            }
            else if (JavascriptNumber::Is_NoTaggedIntCheck(aRight))
            {
                return TaggedInt::ToDouble(aLeft) == JavascriptNumber::GetValue(aRight);
            }
            else
            {
                BOOL res = UnsafeVarTo<RecyclableObject>(aRight)->Equals(aLeft, &result, requestContext);
                AssertMsg(res, "Should have handled this");
                return result;
            }
        }
        else if (JavascriptNumber::Is_NoTaggedIntCheck(aLeft))
        {
            if (TaggedInt::Is(aRight))
            {
                return TaggedInt::ToDouble(aRight) == JavascriptNumber::GetValue(aLeft);
            }
            else if(JavascriptNumber::Is_NoTaggedIntCheck(aRight))
            {
                return JavascriptNumber::GetValue(aLeft) == JavascriptNumber::GetValue(aRight);
            }
            else
            {
                BOOL res = UnsafeVarTo<RecyclableObject>(aRight)->Equals(aLeft, &result, requestContext);
                AssertMsg(res, "Should have handled this");
                return result;
            }
        }

        if (UnsafeVarTo<RecyclableObject>(aLeft)->Equals(aRight, &result, requestContext))
        {
            return result;
        }
        else
        {
            return false;
        }
        JIT_HELPER_END(Op_Equal_Full);
    }